

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86XOR(uchar *stream,x86Reg op1,int num)

{
  bool bVar1;
  
  if (op1 != rEAX) {
    bVar1 = 8 < (int)op1;
    if (bVar1) {
      *stream = 8 < (int)op1 | 0x40;
    }
    stream[bVar1] = 0x81;
    stream[(ulong)bVar1 + 1] = regCode[op1] | 0xf0;
    *(int *)(stream + (ulong)bVar1 + 2) = num;
    return bVar1 + 6;
  }
  *stream = '5';
  *(int *)(stream + 1) = num;
  return 5;
}

Assistant:

int x86XOR(unsigned char *stream, x86Reg op1, int num)
{
	unsigned char *start = stream;

	if(op1 == rEAX)
	{
		stream += encodeRex(stream, false, rNONE, rNONE, op1);
		*stream++ = 0x35;
		stream += encodeImmDword(stream, num);

		return int(stream - start);
	}

	stream += encodeRex(stream, false, rNONE, rNONE, op1);
	*stream++ = 0x81;
	*stream++ = encodeRegister(op1, 6);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}